

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::writeStandard(QPDFWriter *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  qpdf_offset_t max_offset;
  bool bVar4;
  element_type *peVar5;
  size_type sVar6;
  element_type *peVar7;
  reference pvVar8;
  string_view str;
  string_view local_c0;
  string local_b0;
  string_view local_90;
  string_view local_80;
  int local_6c;
  qpdf_offset_t qStack_68;
  int xref_id;
  qpdf_offset_t xref_offset;
  undefined1 local_50 [8];
  QPDFObjectHandle cur_object;
  undefined1 local_20 [8];
  PipelinePopper pp_md5;
  QPDFWriter *this_local;
  
  pp_md5.stack_id = (unsigned_long)this;
  PipelinePopper::PipelinePopper((PipelinePopper *)local_20,this);
  peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar5->deterministic_id & 1U) != 0) {
    pushMD5Pipeline(this,(PipelinePopper *)local_20);
  }
  writeHeader(this);
  peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  str = (string_view)
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((string *)&peVar5->extra_header_text);
  cur_object.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)str._M_len;
  writeString(this,str);
  peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar5->pclm & 1U) == 0) {
    enqueueObjectsStandard(this);
  }
  else {
    enqueueObjectsPCLm(this);
  }
  while( true ) {
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    uVar3 = peVar5->object_queue_front;
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    sVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                      (&peVar5->object_queue);
    if (sVar6 <= uVar3) break;
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    peVar7 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    pvVar8 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                       (&peVar5->object_queue,peVar7->object_queue_front);
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_50,pvVar8);
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    peVar5->object_queue_front = peVar5->object_queue_front + 1;
    QPDFObjectHandle::QPDFObjectHandle
              ((QPDFObjectHandle *)&xref_offset,(QPDFObjectHandle *)local_50);
    writeObject(this,(QPDFObjectHandle *)&xref_offset,-1);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&xref_offset);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_50);
  }
  peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar5->encrypted & 1U) != 0) {
    writeEncryptionDictionary(this);
  }
  peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  qStack_68 = ::qpdf::pl::Count::getCount(peVar5->pipeline);
  peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar4 = std::
          map<int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>_>_>
          ::empty(&peVar5->object_stream_to_objects);
  if (bVar4) {
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    iVar1 = peVar5->next_objid;
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    writeXRefTable(this,t_normal,0,iVar1 + -1,peVar5->next_objid);
  }
  else {
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    max_offset = qStack_68;
    iVar1 = peVar5->next_objid;
    peVar5->next_objid = iVar1 + 1;
    local_6c = iVar1;
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    iVar2 = peVar5->next_objid;
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    writeXRefStream(this,iVar1,iVar1,max_offset,t_normal,0,iVar2 + -1,peVar5->next_objid);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,"startxref\n");
  writeString(this,local_80);
  std::__cxx11::to_string(&local_b0,qStack_68);
  local_90 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_b0);
  writeString(this,local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c0,"\n%%EOF\n");
  writeString(this,local_c0);
  peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar5->deterministic_id & 1U) != 0) {
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    bVar4 = std::
            map<int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>_>_>
            ::empty(&peVar5->object_stream_to_objects);
    QTC::TC("qpdf","QPDFWriter standard deterministic ID",(uint)!bVar4);
  }
  PipelinePopper::~PipelinePopper((PipelinePopper *)local_20);
  return;
}

Assistant:

void
QPDFWriter::writeStandard()
{
    auto pp_md5 = PipelinePopper(this);
    if (m->deterministic_id) {
        pushMD5Pipeline(pp_md5);
    }

    // Start writing

    writeHeader();
    writeString(m->extra_header_text);

    if (m->pclm) {
        enqueueObjectsPCLm();
    } else {
        enqueueObjectsStandard();
    }

    // Now start walking queue, outputting each object.
    while (m->object_queue_front < m->object_queue.size()) {
        QPDFObjectHandle cur_object = m->object_queue.at(m->object_queue_front);
        ++m->object_queue_front;
        writeObject(cur_object);
    }

    // Write out the encryption dictionary, if any
    if (m->encrypted) {
        writeEncryptionDictionary();
    }

    // Now write out xref.  next_objid is now the number of objects.
    qpdf_offset_t xref_offset = m->pipeline->getCount();
    if (m->object_stream_to_objects.empty()) {
        // Write regular cross-reference table
        writeXRefTable(t_normal, 0, m->next_objid - 1, m->next_objid);
    } else {
        // Write cross-reference stream.
        int xref_id = m->next_objid++;
        writeXRefStream(
            xref_id, xref_id, xref_offset, t_normal, 0, m->next_objid - 1, m->next_objid);
    }
    writeString("startxref\n");
    writeString(std::to_string(xref_offset));
    writeString("\n%%EOF\n");

    if (m->deterministic_id) {
        QTC::TC(
            "qpdf",
            "QPDFWriter standard deterministic ID",
            m->object_stream_to_objects.empty() ? 0 : 1);
    }
}